

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey.c
# Opt level: O3

void ssort2(string *a,int n,int depth)

{
  undefined8 uVar1;
  string puVar2;
  string puVar3;
  ulong uVar4;
  string *ppuVar5;
  string *ppuVar6;
  string *ppuVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  byte bVar13;
  byte bVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  string *c;
  
  uVar11 = (ulong)(uint)n;
  if (9 < n) {
    do {
      ppuVar6 = a + (uVar11 >> 1 & 0x7fffffff);
      uVar4 = uVar11 & 0xffffffff;
      c = a + (uVar4 - 1);
      ppuVar7 = c;
      ppuVar5 = a;
      if (0x1e < (uint)uVar11) {
        uVar17 = (ulong)((uint)uVar11 & 0xfffffff8);
        uVar11 = (ulong)((uint)(uVar11 >> 2) & 0x3ffffffe);
        ppuVar5 = med3func(a,(string *)((long)a + uVar17),a + uVar11,depth);
        ppuVar6 = med3func((string *)((long)ppuVar6 - uVar17),ppuVar6,
                           (string *)(uVar17 + (long)ppuVar6),depth);
        ppuVar7 = med3func(c + -uVar11,(string *)((long)c - uVar17),c,depth);
      }
      ppuVar6 = med3func(ppuVar5,ppuVar6,ppuVar7,depth);
      puVar2 = *a;
      *a = *ppuVar6;
      *ppuVar6 = puVar2;
      bVar13 = (*a)[depth];
      ppuVar6 = a + 1;
      ppuVar7 = ppuVar6;
      ppuVar5 = c;
LAB_0025120f:
      for (; ppuVar6 <= ppuVar5; ppuVar6 = ppuVar6 + 1) {
        bVar14 = (*ppuVar6)[depth];
        if (bVar13 < bVar14) break;
        if (bVar14 == bVar13) {
          puVar2 = *ppuVar7;
          *ppuVar7 = *ppuVar6;
          *ppuVar6 = puVar2;
          ppuVar7 = ppuVar7 + 1;
        }
      }
LAB_00251248:
      if (ppuVar6 <= ppuVar5) {
        puVar2 = *ppuVar5;
        if (bVar13 <= puVar2[depth]) goto LAB_00251233;
        puVar3 = *ppuVar6;
        *ppuVar6 = puVar2;
        *ppuVar5 = puVar3;
        ppuVar6 = ppuVar6 + 1;
        ppuVar5 = ppuVar5 + -1;
        goto LAB_0025120f;
      }
      lVar8 = (long)ppuVar7 - (long)a >> 3;
      lVar16 = (long)ppuVar6 - (long)ppuVar7 >> 3;
      if (lVar16 <= lVar8) {
        lVar8 = lVar16;
      }
      uVar10 = (uint)lVar8;
      if (0 < (int)uVar10) {
        uVar9 = uVar10 + 1;
        lVar8 = 0;
        do {
          uVar1 = *(undefined8 *)((long)a + lVar8);
          *(undefined8 *)((long)a + lVar8) =
               *(undefined8 *)((long)ppuVar6 + lVar8 + (ulong)(uVar10 & 0x7fffffff) * -8);
          *(undefined8 *)((long)ppuVar6 + lVar8 + (ulong)(uVar10 & 0x7fffffff) * -8) = uVar1;
          lVar8 = lVar8 + 8;
          uVar9 = uVar9 - 1;
        } while (1 < uVar9);
      }
      uVar11 = (long)c - (long)ppuVar5 >> 3;
      lVar8 = (long)((long)a + (uVar4 * 8 - (long)c)) >> 3;
      uVar9 = (uint)uVar11;
      uVar10 = (int)lVar8 - 1;
      if ((long)uVar11 < lVar8) {
        uVar10 = uVar9;
      }
      if (0 < (int)uVar10) {
        lVar8 = (ulong)(uVar10 & 0x7fffffff) * -8 + uVar4 * 8;
        uVar10 = uVar10 + 1;
        lVar12 = 0;
        do {
          uVar1 = *(undefined8 *)((long)ppuVar6 + lVar12);
          *(undefined8 *)((long)ppuVar6 + lVar12) = *(undefined8 *)((long)a + lVar12 + lVar8);
          *(undefined8 *)((long)a + lVar12 + lVar8) = uVar1;
          lVar12 = lVar12 + 8;
          uVar10 = uVar10 - 1;
        } while (1 < uVar10);
      }
      if (1 < (int)lVar16) {
        ssort2(a,(int)lVar16,depth);
      }
      iVar15 = (int)((ulong)((long)ppuVar6 - (long)ppuVar7) >> 3);
      if (a[iVar15][depth] != '\0') {
        ssort2(a + iVar15,
               (int)((long)a + ((((long)ppuVar7 - (long)a) + uVar4 * 8) - (long)c) >> 3) + -1,
               depth + 1);
      }
      if ((int)uVar9 < 2) {
        return;
      }
      a = a + (uVar4 - (uVar9 & 0x7fffffff));
      if (uVar9 < 10) goto LAB_00251380;
    } while( true );
  }
  if (1 < n) {
LAB_00251380:
    lVar8 = (long)depth;
    ppuVar6 = a;
    do {
      ppuVar6 = ppuVar6 + 1;
      if (a < ppuVar6) {
        puVar2 = *ppuVar6;
        ppuVar7 = ppuVar6;
        do {
          puVar3 = ppuVar7[-1];
          bVar13 = puVar3[lVar8];
          bVar14 = puVar2[lVar8];
          if ((bVar13 != 0) && (lVar16 = lVar8, bVar13 == bVar14)) {
            do {
              lVar16 = lVar16 + 1;
              bVar13 = puVar3[lVar16];
              bVar14 = puVar2[lVar16];
              if (bVar13 == 0) break;
            } while (bVar13 == bVar14);
          }
          if (bVar13 <= bVar14) break;
          *ppuVar7 = puVar3;
          ppuVar7[-1] = puVar2;
          ppuVar7 = ppuVar7 + -1;
        } while (a < ppuVar7);
      }
      iVar15 = (int)uVar11;
      uVar11 = (ulong)(iVar15 - 1);
    } while (2 < iVar15);
  }
  return;
LAB_00251233:
  if (puVar2[depth] == bVar13) {
    *ppuVar5 = *c;
    *c = puVar2;
    c = c + -1;
  }
  ppuVar5 = ppuVar5 + -1;
  goto LAB_00251248;
}

Assistant:

static void ssort2(string a[], int n, int depth)
{   int d, r, partval;
    string *pa, *pb, *pc, *pd, *pl, *pm, *pn, t;
    if (n < 10) {
        insertsort(a, n, depth);
        return;
    }
    pl = a;
    pm = a + (n/2);
    pn = a + (n-1);
    if (n > 30) { /* On big arrays, pseudomedian of 9 */
        d = (n/8);
        pl = med3(pl, pl+d, pl+2*d);
        pm = med3(pm-d, pm, pm+d);
        pn = med3(pn-2*d, pn-d, pn);
    }
    pm = med3(pl, pm, pn);
    swap2(a, pm);
    partval = ptr2char(a);
    pa = pb = a + 1;
    pc = pd = a + n-1;
    for (;;) {
        while (pb <= pc && (r = ptr2char(pb)-partval) <= 0) {
            if (r == 0) { swap2(pa, pb); pa++; }
            pb++;
        }
        while (pb <= pc && (r = ptr2char(pc)-partval) >= 0) {
            if (r == 0) { swap2(pc, pd); pd--; }
            pc--;
        }
        if (pb > pc) break;
        swap2(pb, pc);
        pb++;
        pc--;
    }
    pn = a + n;
    r = min(pa-a, pb-pa);    vecswap2(a,  pb-r, r);
    r = min(pd-pc, pn-pd-1); vecswap2(pb, pn-r, r);
    if ((r = pb-pa) > 1)
        ssort2(a, r, depth);
    if (ptr2char(a + r) != 0)
        ssort2(a + r, pa-a + pn-pd-1, depth+1);
    if ((r = pd-pc) > 1)
        ssort2(a + n-r, r, depth);
}